

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
* duckdb::Parser::ParseExpressionList(string *select_list,ParserOptions options)

{
  ParserOptions options_p;
  size_type sVar1;
  pointer pSVar2;
  undefined8 uVar3;
  pointer pQVar4;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  *in_RDI;
  string *in_stack_00000008;
  Parser *in_stack_00000010;
  SelectNode *select_node;
  SelectStatement *select;
  Parser parser;
  string mock_query;
  string *in_stack_00000398;
  Parser *in_stack_000003a0;
  Parser *this;
  undefined8 in_stack_fffffffffffffea0;
  undefined8 in_stack_fffffffffffffea8;
  vector<duckdb::ParserExtension,_true> *in_stack_fffffffffffffeb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed0;
  char *in_stack_fffffffffffffed8;
  allocator local_d9;
  string local_d8 [32];
  SelectStatement *local_b8;
  undefined1 local_aa;
  allocator local_a9;
  string local_a8 [72];
  vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
  local_60 [2];
  string local_30 [48];
  
  ::std::operator+(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
  options_p.max_expression_depth = in_stack_fffffffffffffea8;
  options_p.preserve_identifier_case = (bool)(char)in_stack_fffffffffffffea0;
  options_p.integer_division = (bool)(char)((ulong)in_stack_fffffffffffffea0 >> 8);
  options_p._2_6_ = (int6)((ulong)in_stack_fffffffffffffea0 >> 0x10);
  options_p.extensions = in_stack_fffffffffffffeb0;
  Parser(in_stack_00000010,options_p);
  ParseQuery(in_stack_000003a0,in_stack_00000398);
  sVar1 = ::std::
          vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
          ::size(local_60);
  this = in_stack_00000010;
  if (sVar1 == 1) {
    vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_true>
    ::operator[](&in_stack_00000010->statements,(size_type)in_stack_00000008);
    pSVar2 = unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>::
             operator->((unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>
                         *)in_stack_00000010);
    this = in_stack_00000010;
    if (pSVar2->type == SELECT_STATEMENT) {
      vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_true>
      ::operator[](&in_stack_00000010->statements,(size_type)in_stack_00000008);
      pSVar2 = unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>::
               operator->((unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>
                           *)in_stack_00000010);
      local_b8 = SQLStatement::Cast<duckdb::SelectStatement>(pSVar2);
      pQVar4 = unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>::
               operator->((unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>
                           *)in_stack_00000010);
      if (pQVar4->type != SELECT_NODE) {
        uVar3 = __cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_d8,"Expected a single SELECT node",&local_d9);
        ParserException::ParserException((ParserException *)in_stack_00000010,in_stack_00000008);
        __cxa_throw(uVar3,&ParserException::typeinfo,ParserException::~ParserException);
      }
      unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>::operator->
                ((unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true> *)
                 in_stack_00000010);
      QueryNode::Cast<duckdb::SelectNode>((QueryNode *)pSVar2);
      vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
      ::vector((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                *)in_stack_00000010,
               (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                *)in_stack_00000008);
      ~Parser((Parser *)0x23558b);
      ::std::__cxx11::string::~string(local_30);
      return in_RDI;
    }
  }
  local_aa = 1;
  uVar3 = __cxa_allocate_exception(0x10);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_a8,"Expected a single SELECT statement",&local_a9);
  ParserException::ParserException((ParserException *)this,in_stack_00000008);
  local_aa = 0;
  __cxa_throw(uVar3,&ParserException::typeinfo,ParserException::~ParserException);
}

Assistant:

vector<unique_ptr<ParsedExpression>> Parser::ParseExpressionList(const string &select_list, ParserOptions options) {
	// construct a mock query prefixed with SELECT
	string mock_query = "SELECT " + select_list;
	// parse the query
	Parser parser(options);
	parser.ParseQuery(mock_query);
	// check the statements
	if (parser.statements.size() != 1 || parser.statements[0]->type != StatementType::SELECT_STATEMENT) {
		throw ParserException("Expected a single SELECT statement");
	}
	auto &select = parser.statements[0]->Cast<SelectStatement>();
	if (select.node->type != QueryNodeType::SELECT_NODE) {
		throw ParserException("Expected a single SELECT node");
	}
	auto &select_node = select.node->Cast<SelectNode>();
	return std::move(select_node.select_list);
}